

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O3

void tommy_hashlin_insert
               (tommy_hashlin *hashlin,tommy_hashlin_node *node,void *data,tommy_hash_t hash)

{
  tommy_hashlin_node *ptVar1;
  tommy_hashlin_node **pptVar2;
  tommy_node_struct *ptVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  tommy_uint_t tVar8;
  tommy_count_t tVar9;
  ulong uVar10;
  uint uVar11;
  tommy_node_struct *ptVar12;
  uint uVar13;
  tommy_node_struct *ptVar14;
  long in_FS_OFFSET;
  tommy_hashlin_node **local_28 [3];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = hashlin->low_mask & hash;
  uVar6 = hashlin->split;
  if (uVar11 < uVar6) {
    uVar11 = hashlin->bucket_mask & hash;
  }
  uVar4 = 0x1f;
  if ((uVar11 | 1) != 0) {
    for (; (uVar11 | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  ptVar1 = hashlin->bucket[uVar4][uVar11];
  if (ptVar1 == (tommy_hashlin_node *)0x0) {
    ptVar12 = (tommy_node_struct *)(hashlin->bucket[uVar4] + uVar11);
    node->prev = node;
  }
  else {
    node->prev = ptVar1->prev;
    ptVar1->prev = node;
    ptVar12 = node->prev;
  }
  node->next = (tommy_node_struct *)0x0;
  ptVar12->next = node;
  node->data = data;
  node->key = hash;
  uVar11 = hashlin->count + 1;
  hashlin->count = uVar11;
  if (hashlin->state != 1) {
    uVar4 = hashlin->bucket_max;
    if (uVar11 <= uVar4 >> 1) goto LAB_001104bd;
    if (hashlin->state == 0) {
      hashlin->low_max = uVar4;
      hashlin->low_mask = hashlin->bucket_mask;
      pvVar7 = lrtr_malloc((ulong)uVar4 * 8);
      tVar8 = hashlin->bucket_bit + 1;
      tVar9 = 1 << ((byte)tVar8 & 0x1f);
      hashlin->bucket[hashlin->bucket_bit] =
           (tommy_hashlin_node **)((long)pvVar7 + (ulong)hashlin->low_max * -8);
      hashlin->bucket_bit = tVar8;
      hashlin->bucket_max = tVar9;
      hashlin->bucket_mask = tVar9 - 1;
      hashlin->split = 0;
      uVar11 = hashlin->count;
      uVar6 = 0;
    }
    hashlin->state = 1;
  }
  uVar4 = hashlin->low_max;
  if (uVar6 + uVar4 < uVar11 * 2) {
    uVar10 = (ulong)(uVar6 + uVar4);
    do {
      uVar5 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      local_28[0] = hashlin->bucket[uVar5] + uVar6;
      uVar13 = (uint)uVar10 | 1;
      uVar5 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      pptVar2 = hashlin->bucket[uVar5];
      local_28[1] = pptVar2 + uVar10;
      ptVar1 = *local_28[0];
      *local_28[0] = (tommy_hashlin_node *)0x0;
      pptVar2[uVar10] = (tommy_hashlin_node *)0x0;
      while (ptVar1 != (tommy_hashlin_node *)0x0) {
        ptVar12 = ptVar1->next;
        ptVar14 = (tommy_node_struct *)local_28[(ptVar1->key & uVar4) != 0];
        ptVar3 = ptVar14->next;
        if (ptVar3 == (tommy_node_struct *)0x0) {
          ptVar1->prev = ptVar1;
        }
        else {
          ptVar1->prev = ptVar3->prev;
          ptVar3->prev = ptVar1;
          ptVar14 = ptVar1->prev;
        }
        ptVar1->next = (tommy_node_struct *)0x0;
        ptVar14->next = ptVar1;
        ptVar1 = ptVar12;
      }
      uVar6 = uVar6 + 1;
      if (uVar6 == uVar4) {
        hashlin->state = 0;
        hashlin->low_max = hashlin->bucket_max;
        hashlin->low_mask = hashlin->bucket_mask;
        hashlin->split = 0;
        goto LAB_001104bd;
      }
      uVar10 = uVar10 + 1;
    } while ((uint)uVar10 < uVar11 * 2);
    hashlin->split = uVar6;
  }
LAB_001104bd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_hashlin_insert(tommy_hashlin* hashlin, tommy_hashlin_node* node, void* data, tommy_hash_t hash)
{
	tommy_list_insert_tail(tommy_hashlin_bucket_ref(hashlin, hash), node, data);

	node->key = hash;

	++hashlin->count;

	hashlin_grow_step(hashlin);
}